

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChDebugDrawer::drawContactPoint
          (ChDebugDrawer *this,cbtVector3 *PointOnB,cbtVector3 *normalOnB,cbtScalar distance,
          int lifeTime,cbtVector3 *color)

{
  float fVar1;
  undefined1 auVar2 [16];
  cbtScalar acVar3 [4];
  double dVar4;
  ulong extraout_XMM0_Qb;
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  cbtVector3 cVar10;
  undefined1 local_78 [16];
  double local_68;
  cbtVector3 local_58;
  double local_48;
  undefined8 local_38;
  cbtScalar local_30;
  undefined1 auVar9 [56];
  
  fVar1 = PointOnB->m_floats[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)PointOnB->m_floats;
  acVar3 = (cbtScalar  [4])vcvtps2pd_avx(auVar2);
  dVar4 = (double)(**(code **)(*(long *)this->m_vis + 0x18))();
  auVar7 = ZEXT856(extraout_XMM0_Qb);
  local_78._0_4_ = (float)dVar4;
  auVar9 = extraout_var;
  cVar10 = ::operator*(normalOnB,(cbtScalar *)local_78);
  auVar8._0_8_ = cVar10.m_floats._8_8_;
  auVar8._8_56_ = auVar9;
  auVar5._0_8_ = cVar10.m_floats._0_8_;
  auVar5._8_56_ = auVar7;
  local_58.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar8._0_16_);
  auVar9 = ZEXT856(local_58.m_floats._8_8_);
  cVar10 = ::operator+(PointOnB,&local_58);
  auVar6._0_8_ = cVar10.m_floats._0_8_;
  auVar6._8_56_ = auVar9;
  local_68 = (double)cVar10.m_floats[2];
  local_78 = vcvtps2pd_avx(auVar6._0_16_);
  local_30 = color->m_floats[2];
  local_38 = *(undefined8 *)color->m_floats;
  local_58.m_floats = acVar3;
  local_48 = (double)fVar1;
  (**(code **)(*(long *)this->m_vis + 0x10))(this->m_vis,&local_58,local_78);
  return;
}

Assistant:

void drawContactPoint(const cbtVector3& PointOnB,
                          const cbtVector3& normalOnB,
                          cbtScalar distance,
                          int lifeTime,
                          const cbtVector3& color) override {
        cbtVector3 from = PointOnB;
        cbtVector3 to = PointOnB + m_vis->GetNormalScale() * normalOnB;
        m_vis->DrawLine(ChVector<>(from.x(), from.y(), from.z()), ChVector<>(to.x(), to.y(), to.z()),
                        ChColor(color.x(), color.y(), color.z()));
    }